

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O1

int ARKBBDPrecGetWorkSpace(void *arkode_mem,long *lenrwBBDP,long *leniwBBDP)

{
  void *pvVar1;
  int iVar2;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_28;
  ARKodeMem local_20;
  
  iVar2 = arkLs_AccessARKODELMem(arkode_mem,"ARKBBDPrecGetWorkSpace",&local_20,&local_28);
  if (iVar2 == 0) {
    pvVar1 = local_28->P_data;
    if (pvVar1 == (void *)0x0) {
      iVar2 = -5;
      arkProcessError(local_20,-5,0x157,"ARKBBDPrecGetWorkSpace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"BBD peconditioner memory is NULL. ARKBBDPrecInit must be called.");
    }
    else {
      *lenrwBBDP = *(long *)((long)pvVar1 + 0x80);
      *leniwBBDP = *(long *)((long)pvVar1 + 0x88);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ARKBBDPrecGetWorkSpace(void* arkode_mem, long int* lenrwBBDP,
                           long int* leniwBBDP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately ARKBBDPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BBD_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  /* set outputs */
  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (ARKLS_SUCCESS);
}